

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

void __thiscall
MemoryLeakDetector::deallocMemory
          (MemoryLeakDetector *this,TestMemoryAllocator *allocator,void *memory,char *file,
          size_t line,bool allocatNodesSeperately)

{
  bool bVar1;
  MemoryLeakDetectorNode *pMVar2;
  TestMemoryAllocator *in_RCX;
  size_t in_RDX;
  TestMemoryAllocator *in_RSI;
  MemoryLeakOutputStringBuffer *in_RDI;
  MemoryLeakFailure *in_R8;
  size_t size;
  MemoryLeakDetectorNode *node;
  undefined7 in_stack_00000018;
  MemoryLeakDetectorTable *in_stack_ffffffffffffffc0;
  undefined8 uVar3;
  
  if (in_RDX != 0) {
    pMVar2 = MemoryLeakDetectorTable::removeNode(in_stack_ffffffffffffffc0,(char *)in_RDI);
    if (pMVar2 == (MemoryLeakDetectorNode *)0x0) {
      MemoryLeakOutputStringBuffer::reportDeallocateNonAllocatedMemoryFailure
                (in_RDI,(char *)in_RSI,in_RDX,in_RCX,in_R8);
    }
    else {
      bVar1 = TestMemoryAllocator::hasBeenDestroyed(in_RSI);
      if (!bVar1) {
        uVar3 = *(undefined8 *)pMVar2;
        checkForCorruption((MemoryLeakDetector *)memory,(MemoryLeakDetectorNode *)file,(char *)line,
                           CONCAT17(allocatNodesSeperately,in_stack_00000018),
                           (TestMemoryAllocator *)node,size._7_1_);
        (*in_RSI->_vptr_TestMemoryAllocator[3])(in_RSI,in_RDX,uVar3,in_RCX,in_R8);
      }
    }
  }
  return;
}

Assistant:

void MemoryLeakDetector::deallocMemory(TestMemoryAllocator* allocator, void* memory, const char* file, size_t line, bool allocatNodesSeperately)
{
    if (memory == NULLPTR) return;

    MemoryLeakDetectorNode* node = memoryTable_.removeNode((char*) memory);
    if (node == NULLPTR) {
        outputBuffer_.reportDeallocateNonAllocatedMemoryFailure(file, line, allocator, reporter_);
        return;
    }
#ifdef CPPUTEST_DISABLE_MEM_CORRUPTION_CHECK
   allocatNodesSeperately = true;
#endif
    if (!allocator->hasBeenDestroyed()) {
        size_t size = node->size_;
        checkForCorruption(node, file, line, allocator, allocatNodesSeperately);
        allocator->free_memory((char*) memory, size, file, line);
    }
}